

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

int __thiscall ImDrawList::_CalcCircleAutoSegmentCount(ImDrawList *this,float radius)

{
  int iVar1;
  float fVar2;
  
  if ((int)(radius + 0.999999) < 0x40) {
    return (int)this->_Data->CircleSegmentCounts[(int)(radius + 0.999999)];
  }
  fVar2 = this->_Data->CircleSegmentMaxError;
  if (radius <= fVar2) {
    fVar2 = radius;
  }
  fVar2 = acosf(1.0 - fVar2 / radius);
  fVar2 = ceilf(3.1415927 / fVar2);
  iVar1 = (((int)fVar2 + 1) / 2) * 2;
  if (0x1ff < iVar1) {
    iVar1 = 0x200;
  }
  if (iVar1 < 5) {
    iVar1 = 4;
  }
  return iVar1;
}

Assistant:

int ImDrawList::_CalcCircleAutoSegmentCount(float radius) const
{
    // Automatic segment count
    const int radius_idx = (int)(radius + 0.999999f); // ceil to never reduce accuracy
    if (radius_idx < IM_ARRAYSIZE(_Data->CircleSegmentCounts))
        return _Data->CircleSegmentCounts[radius_idx]; // Use cached value
    else
        return IM_DRAWLIST_CIRCLE_AUTO_SEGMENT_CALC(radius, _Data->CircleSegmentMaxError);
}